

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.cc
# Opt level: O0

int main(void)

{
  allocator<QPDFObjectHandle> *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  longlong lVar4;
  ostream *this_00;
  bool local_10d2;
  bool local_10be;
  bool local_10b2;
  bool local_109e;
  bool local_1092;
  bool local_107e;
  bool local_104a;
  bool local_103a;
  bool local_1033;
  bool local_1022;
  bool local_101a;
  bool local_1006;
  bool local_fed;
  bool local_fe9;
  bool local_fe6;
  bool local_fcd;
  bool local_fca;
  bool local_fa7;
  bool local_fa2;
  logic_error *anon_var_0_1;
  QPDFObjectHandle local_f18;
  QPDFObjectHandle local_f08;
  QPDF local_ef8;
  QPDF pdf2;
  logic_error *anon_var_0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_ee0;
  string local_ed8;
  string local_eb8;
  QPDFObjectHandle local_e98;
  pair<bool,_QPDFObjectHandle> local_e88;
  QPDFObjectHandle local_e70;
  undefined1 local_e60 [8];
  QPDFObjectHandle d;
  undefined1 local_e40 [8];
  QPDFObjectHandle c;
  string local_e20;
  pair<bool,_QPDFObjectHandle> local_e00;
  pair<bool,_QPDFObjectHandle> local_de8;
  pair<bool,_QPDFObjectHandle> local_dd0;
  QPDFObjectHandle local_db8;
  QPDFObjectHandle local_da8;
  undefined1 local_d98 [8];
  Array b;
  QPDFObjectHandle local_d78;
  QPDFObjectHandle local_d68;
  QPDFObjectHandle local_d58;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_d48;
  undefined1 local_d30 [16];
  QPDF pdf;
  pair<bool,_QPDFObjectHandle> local_d10;
  string local_cf8;
  pair<bool,_QPDFObjectHandle> local_cd8;
  byte local_cb9;
  pair<bool,_QPDFObjectHandle> local_cb8;
  pair<bool,_QPDFObjectHandle> local_ca0;
  byte local_c82;
  byte local_c81;
  pair<bool,_QPDFObjectHandle> local_c80;
  string local_c68;
  pair<bool,_QPDFObjectHandle> local_c48;
  byte local_c2a;
  byte local_c29;
  pair<bool,_QPDFObjectHandle> local_c28;
  string local_c10;
  pair<bool,_QPDFObjectHandle> local_bf0;
  byte local_bd1;
  pair<bool,_QPDFObjectHandle> local_bd0;
  pair<bool,_QPDFObjectHandle> local_bb8;
  byte local_b9a;
  byte local_b99;
  pair<bool,_QPDFObjectHandle> local_b98;
  string local_b80;
  pair<bool,_QPDFObjectHandle> local_b60;
  pair<bool,_QPDFObjectHandle> local_b48;
  byte local_b2a;
  byte local_b29;
  pair<bool,_QPDFObjectHandle> local_b28;
  string local_b10;
  pair<bool,_QPDFObjectHandle> local_af0;
  byte local_ad1;
  pair<bool,_QPDFObjectHandle> local_ad0;
  pair<bool,_QPDFObjectHandle> local_ab8;
  byte local_a9a;
  byte local_a99;
  pair<bool,_QPDFObjectHandle> local_a98;
  string local_a80;
  pair<bool,_QPDFObjectHandle> local_a60;
  pair<bool,_QPDFObjectHandle> local_a48;
  QPDFObjectHandle local_a30;
  byte local_a19;
  pair<bool,_QPDFObjectHandle> local_a18;
  pair<bool,_QPDFObjectHandle> local_a00;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  QPDFObjectHandle local_998;
  pair<bool,_QPDFObjectHandle> local_988;
  pair<bool,_QPDFObjectHandle> local_970;
  byte local_952;
  byte local_951;
  pair<bool,_QPDFObjectHandle> local_950;
  string local_938;
  pair<bool,_QPDFObjectHandle> local_918;
  byte local_8f9;
  pair<bool,_QPDFObjectHandle> local_8f8;
  pair<bool,_QPDFObjectHandle> local_8e0;
  byte local_8c2;
  byte local_8c1;
  pair<bool,_QPDFObjectHandle> local_8c0;
  string local_8a8;
  pair<bool,_QPDFObjectHandle> local_888;
  byte local_86a;
  byte local_869;
  pair<bool,_QPDFObjectHandle> local_868;
  string local_850;
  pair<bool,_QPDFObjectHandle> local_830;
  pair<bool,_QPDFObjectHandle> local_818;
  byte local_7f9;
  pair<bool,_QPDFObjectHandle> local_7f8;
  pair<bool,_QPDFObjectHandle> local_7e0;
  byte local_7c2;
  byte local_7c1;
  pair<bool,_QPDFObjectHandle> local_7c0;
  string local_7a8;
  pair<bool,_QPDFObjectHandle> local_788;
  byte local_76a;
  byte local_769;
  pair<bool,_QPDFObjectHandle> local_768;
  string local_750;
  pair<bool,_QPDFObjectHandle> local_730;
  byte local_711;
  pair<bool,_QPDFObjectHandle> local_710;
  pair<bool,_QPDFObjectHandle> local_6f8;
  byte local_6da;
  byte local_6d9;
  pair<bool,_QPDFObjectHandle> local_6d8;
  string local_6c0;
  pair<bool,_QPDFObjectHandle> local_6a0;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  QPDFObjectHandle local_638;
  byte local_622;
  byte local_621;
  pair<bool,_QPDFObjectHandle> local_620;
  string local_608;
  pair<bool,_QPDFObjectHandle> local_5e8;
  pair<bool,_QPDFObjectHandle> local_5d0;
  byte local_5b2;
  byte local_5b1;
  pair<bool,_QPDFObjectHandle> local_5b0;
  string local_598;
  pair<bool,_QPDFObjectHandle> local_578;
  byte local_55a;
  byte local_559;
  pair<bool,_QPDFObjectHandle> local_558;
  string local_540;
  pair<bool,_QPDFObjectHandle> local_520;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  QPDFObjectHandle local_4b8;
  byte local_4a2;
  byte local_4a1;
  pair<bool,_QPDFObjectHandle> local_4a0;
  string local_488;
  pair<bool,_QPDFObjectHandle> local_468;
  byte local_44a;
  byte local_449;
  pair<bool,_QPDFObjectHandle> local_448;
  string local_430;
  pair<bool,_QPDFObjectHandle> local_410;
  byte local_3f1;
  pair<bool,_QPDFObjectHandle> local_3f0;
  pair<bool,_QPDFObjectHandle> local_3d8;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  QPDFObjectHandle local_370;
  byte local_35a;
  byte local_359;
  pair<bool,_QPDFObjectHandle> local_358;
  string local_340;
  pair<bool,_QPDFObjectHandle> local_320;
  pair<bool,_QPDFObjectHandle> local_308;
  pair<bool,_QPDFObjectHandle> local_2f0;
  byte local_2d2;
  byte local_2d1;
  pair<bool,_QPDFObjectHandle> local_2d0;
  string local_2b8;
  pair<bool,_QPDFObjectHandle> local_298;
  byte local_279;
  pair<bool,_QPDFObjectHandle> local_278;
  pair<bool,_QPDFObjectHandle> local_260;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  QPDFObjectHandle local_1f8;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  QPDFObjectHandle local_198;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  QPDFObjectHandle local_138;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  QPDFObjectHandle local_d8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  QPDFObjectHandle local_78;
  undefined1 local_68 [8];
  Array a;
  bool local_39;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_38;
  undefined1 local_20 [8];
  shared_ptr<QPDFObject> obj;
  
  obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_38);
  local_39 = true;
  QPDFObject::create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
            ((QPDFObject *)local_20,&local_38,&local_39);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_38);
  qpdf::Array::Array((Array *)local_68,(shared_ptr<QPDFObject> *)local_20);
  iVar3 = qpdf::Array::size((Array *)local_68);
  if (iVar3 != 0) {
    __assert_fail("a.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0xf,"int main()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"1",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  QPDFObjectHandle::parse(&local_78,&local_98,&local_c0);
  qpdf::Array::push_back((Array *)local_68,&local_78);
  QPDFObjectHandle::~QPDFObjectHandle(&local_78);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"(potato)",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
  QPDFObjectHandle::parse(&local_d8,&local_f8,&local_120);
  qpdf::Array::push_back((Array *)local_68,&local_d8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"null",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_181);
  QPDFObjectHandle::parse(&local_138,&local_158,&local_180);
  qpdf::Array::push_back((Array *)local_68,&local_138);
  QPDFObjectHandle::~QPDFObjectHandle(&local_138);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"null",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_1e1);
  QPDFObjectHandle::parse(&local_198,&local_1b8,&local_1e0);
  qpdf::Array::push_back((Array *)local_68,&local_198);
  QPDFObjectHandle::~QPDFObjectHandle(&local_198);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"/Quack",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_241);
  QPDFObjectHandle::parse(&local_1f8,&local_218,&local_240);
  qpdf::Array::push_back((Array *)local_68,&local_1f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1f8);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  iVar3 = qpdf::Array::size((Array *)local_68);
  if (iVar3 != 5) {
    __assert_fail("a.size() == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x16,"int main()");
  }
  local_279 = 0;
  qpdf::Array::at(&local_260,(Array *)local_68,0);
  bVar1 = QPDFObjectHandle::isInteger(&local_260.second);
  bVar2 = false;
  if (bVar1) {
    qpdf::Array::at(&local_278,(Array *)local_68,0);
    local_279 = 1;
    lVar4 = QPDFObjectHandle::getIntValue(&local_278.second);
    bVar2 = lVar4 == 1;
  }
  if (!bVar2) {
    __assert_fail("a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x17,"int main()");
  }
  if ((local_279 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_278);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_260);
  local_2d1 = 0;
  local_2d2 = 0;
  qpdf::Array::at(&local_298,(Array *)local_68,1);
  bVar2 = QPDFObjectHandle::isString(&local_298.second);
  local_fa2 = false;
  if (bVar2) {
    qpdf::Array::at(&local_2d0,(Array *)local_68,1);
    local_2d1 = 1;
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_2b8,&local_2d0.second);
    local_2d2 = 1;
    local_fa2 = std::operator==(&local_2b8,"potato");
  }
  if (local_fa2 == false) {
    __assert_fail("a.at(1).second.isString() && (a.at(1).second.getStringValue() == \"potato\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x18,"int main()");
  }
  if ((local_2d2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  if ((local_2d1 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_2d0);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_298);
  qpdf::Array::at(&local_2f0,(Array *)local_68,2);
  bVar2 = QPDFObjectHandle::isNull(&local_2f0.second);
  if (!bVar2) {
    __assert_fail("a.at(2).second.isNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x19,"int main()");
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_2f0);
  qpdf::Array::at(&local_308,(Array *)local_68,3);
  bVar2 = QPDFObjectHandle::isNull(&local_308.second);
  if (!bVar2) {
    __assert_fail("a.at(3).second.isNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x1a,"int main()");
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_308);
  local_359 = 0;
  local_35a = 0;
  qpdf::Array::at(&local_320,(Array *)local_68,4);
  bVar2 = QPDFObjectHandle::isName(&local_320.second);
  local_fa7 = false;
  if (bVar2) {
    qpdf::Array::at(&local_358,(Array *)local_68,4);
    local_359 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_340,&local_358.second);
    local_35a = 1;
    local_fa7 = std::operator==(&local_340,"/Quack");
  }
  if (local_fa7 == false) {
    __assert_fail("a.at(4).second.isName() && (a.at(4).second.getName() == \"/Quack\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x1b,"int main()");
  }
  if ((local_35a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((local_359 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_358);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"/BeforeQuack",&local_391)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"",&local_3b9);
  QPDFObjectHandle::parse(&local_370,&local_390,&local_3b8);
  qpdf::Array::insert((Array *)local_68,4,&local_370);
  QPDFObjectHandle::~QPDFObjectHandle(&local_370);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  iVar3 = qpdf::Array::size((Array *)local_68);
  if (iVar3 != 6) {
    __assert_fail("a.size() == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x1e,"int main()");
  }
  local_3f1 = 0;
  qpdf::Array::at(&local_3d8,(Array *)local_68,0);
  bVar1 = QPDFObjectHandle::isInteger(&local_3d8.second);
  bVar2 = false;
  if (bVar1) {
    qpdf::Array::at(&local_3f0,(Array *)local_68,0);
    local_3f1 = 1;
    lVar4 = QPDFObjectHandle::getIntValue(&local_3f0.second);
    bVar2 = lVar4 == 1;
  }
  if (!bVar2) {
    __assert_fail("a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x1f,"int main()");
  }
  if ((local_3f1 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_3f0);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_3d8);
  local_449 = 0;
  local_44a = 0;
  qpdf::Array::at(&local_410,(Array *)local_68,4);
  bVar2 = QPDFObjectHandle::isName(&local_410.second);
  local_fca = false;
  if (bVar2) {
    qpdf::Array::at(&local_448,(Array *)local_68,4);
    local_449 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_430,&local_448.second);
    local_44a = 1;
    local_fca = std::operator==(&local_430,"/BeforeQuack");
  }
  if (local_fca == false) {
    __assert_fail("a.at(4).second.isName() && (a.at(4).second.getName() == \"/BeforeQuack\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x20,"int main()");
  }
  if ((local_44a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_430);
  }
  if ((local_449 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_448);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_410);
  local_4a1 = 0;
  local_4a2 = 0;
  qpdf::Array::at(&local_468,(Array *)local_68,5);
  bVar2 = QPDFObjectHandle::isName(&local_468.second);
  local_fcd = false;
  if (bVar2) {
    qpdf::Array::at(&local_4a0,(Array *)local_68,5);
    local_4a1 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_488,&local_4a0.second);
    local_4a2 = 1;
    local_fcd = std::operator==(&local_488,"/Quack");
  }
  if (local_fcd == false) {
    __assert_fail("a.at(5).second.isName() && (a.at(5).second.getName() == \"/Quack\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x21,"int main()");
  }
  if ((local_4a2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_488);
  }
  if ((local_4a1 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_4a0);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"/Third",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_501);
  QPDFObjectHandle::parse(&local_4b8,&local_4d8,&local_500);
  qpdf::Array::insert((Array *)local_68,2,&local_4b8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_4b8);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  iVar3 = qpdf::Array::size((Array *)local_68);
  if (iVar3 != 7) {
    __assert_fail("a.size() == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x24,"int main()");
  }
  local_559 = 0;
  local_55a = 0;
  qpdf::Array::at(&local_520,(Array *)local_68,1);
  bVar2 = QPDFObjectHandle::isString(&local_520.second);
  local_fe6 = false;
  if (bVar2) {
    qpdf::Array::at(&local_558,(Array *)local_68,1);
    local_559 = 1;
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_540,&local_558.second);
    local_55a = 1;
    local_fe6 = std::operator==(&local_540,"potato");
  }
  if (local_fe6 == false) {
    __assert_fail("a.at(1).second.isString() && (a.at(1).second.getStringValue() == \"potato\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x25,"int main()");
  }
  if ((local_55a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_540);
  }
  if ((local_559 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_558);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_520);
  local_5b1 = 0;
  local_5b2 = 0;
  qpdf::Array::at(&local_578,(Array *)local_68,2);
  bVar2 = QPDFObjectHandle::isName(&local_578.second);
  local_fe9 = false;
  if (bVar2) {
    qpdf::Array::at(&local_5b0,(Array *)local_68,2);
    local_5b1 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_598,&local_5b0.second);
    local_5b2 = 1;
    local_fe9 = std::operator==(&local_598,"/Third");
  }
  if (local_fe9 == false) {
    __assert_fail("a.at(2).second.isName() && (a.at(2).second.getName() == \"/Third\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x26,"int main()");
  }
  if ((local_5b2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_598);
  }
  if ((local_5b1 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_5b0);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_578);
  qpdf::Array::at(&local_5d0,(Array *)local_68,3);
  bVar2 = QPDFObjectHandle::isNull(&local_5d0.second);
  if (!bVar2) {
    __assert_fail("a.at(3).second.isNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x27,"int main()");
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_5d0);
  local_621 = 0;
  local_622 = 0;
  qpdf::Array::at(&local_5e8,(Array *)local_68,6);
  bVar2 = QPDFObjectHandle::isName(&local_5e8.second);
  local_fed = false;
  if (bVar2) {
    qpdf::Array::at(&local_620,(Array *)local_68,6);
    local_621 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_608,&local_620.second);
    local_622 = 1;
    local_fed = std::operator==(&local_608,"/Quack");
  }
  if (local_fed == false) {
    __assert_fail("a.at(6).second.isName() && (a.at(6).second.getName() == \"/Quack\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x28,"int main()");
  }
  if ((local_622 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_608);
  }
  if ((local_621 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_620);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"/First",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"",&local_681);
  QPDFObjectHandle::parse(&local_638,&local_658,&local_680);
  qpdf::Array::insert((Array *)local_68,0,&local_638);
  QPDFObjectHandle::~QPDFObjectHandle(&local_638);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  iVar3 = qpdf::Array::size((Array *)local_68);
  if (iVar3 != 8) {
    __assert_fail("a.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x2b,"int main()");
  }
  local_6d9 = 0;
  local_6da = 0;
  qpdf::Array::at(&local_6a0,(Array *)local_68,0);
  bVar2 = QPDFObjectHandle::isName(&local_6a0.second);
  local_1006 = false;
  if (bVar2) {
    qpdf::Array::at(&local_6d8,(Array *)local_68,0);
    local_6d9 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_6c0,&local_6d8.second);
    local_6da = 1;
    local_1006 = std::operator==(&local_6c0,"/First");
  }
  if (local_1006 == false) {
    __assert_fail("a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x2c,"int main()");
  }
  if ((local_6da & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_6c0);
  }
  if ((local_6d9 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_6d8);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_6a0);
  local_711 = 0;
  qpdf::Array::at(&local_6f8,(Array *)local_68,1);
  bVar1 = QPDFObjectHandle::isInteger(&local_6f8.second);
  bVar2 = false;
  if (bVar1) {
    qpdf::Array::at(&local_710,(Array *)local_68,1);
    local_711 = 1;
    lVar4 = QPDFObjectHandle::getIntValue(&local_710.second);
    bVar2 = lVar4 == 1;
  }
  if (!bVar2) {
    __assert_fail("a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x2d,"int main()");
  }
  if ((local_711 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_710);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_6f8);
  local_769 = 0;
  local_76a = 0;
  qpdf::Array::at(&local_730,(Array *)local_68,7);
  bVar2 = QPDFObjectHandle::isName(&local_730.second);
  local_101a = false;
  if (bVar2) {
    qpdf::Array::at(&local_768,(Array *)local_68,7);
    local_769 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_750,&local_768.second);
    local_76a = 1;
    local_101a = std::operator==(&local_750,"/Quack");
  }
  if (local_101a == false) {
    __assert_fail("a.at(7).second.isName() && (a.at(7).second.getName() == \"/Quack\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x2e,"int main()");
  }
  if ((local_76a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_750);
  }
  if ((local_769 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_768);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_730);
  qpdf::Array::erase((Array *)local_68,6);
  iVar3 = qpdf::Array::size((Array *)local_68);
  if (iVar3 != 7) {
    __assert_fail("a.size() == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x31,"int main()");
  }
  local_7c1 = 0;
  local_7c2 = 0;
  qpdf::Array::at(&local_788,(Array *)local_68,0);
  bVar2 = QPDFObjectHandle::isName(&local_788.second);
  local_1022 = false;
  if (bVar2) {
    qpdf::Array::at(&local_7c0,(Array *)local_68,0);
    local_7c1 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_7a8,&local_7c0.second);
    local_7c2 = 1;
    local_1022 = std::operator==(&local_7a8,"/First");
  }
  if (local_1022 == false) {
    __assert_fail("a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x32,"int main()");
  }
  if ((local_7c2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_7a8);
  }
  if ((local_7c1 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_7c0);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_788);
  local_7f9 = 0;
  qpdf::Array::at(&local_7e0,(Array *)local_68,1);
  bVar1 = QPDFObjectHandle::isInteger(&local_7e0.second);
  bVar2 = false;
  if (bVar1) {
    qpdf::Array::at(&local_7f8,(Array *)local_68,1);
    local_7f9 = 1;
    lVar4 = QPDFObjectHandle::getIntValue(&local_7f8.second);
    bVar2 = lVar4 == 1;
  }
  if (!bVar2) {
    __assert_fail("a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x33,"int main()");
  }
  if ((local_7f9 & 1) != 0) {
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_7f8);
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_7e0);
  qpdf::Array::at(&local_818,(Array *)local_68,5);
  bVar2 = QPDFObjectHandle::isNull(&local_818.second);
  if (!bVar2) {
    __assert_fail("a.at(5).second.isNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x34,"int main()");
  }
  std::pair<bool,_QPDFObjectHandle>::~pair(&local_818);
  local_869 = 0;
  local_86a = 0;
  qpdf::Array::at(&local_830,(Array *)local_68,6);
  bVar2 = QPDFObjectHandle::isName(&local_830.second);
  local_1033 = false;
  if (bVar2) {
    qpdf::Array::at(&local_868,(Array *)local_68,6);
    local_869 = 1;
    QPDFObjectHandle::getName_abi_cxx11_(&local_850,&local_868.second);
    local_86a = 1;
    local_1033 = std::operator==(&local_850,"/Quack");
  }
  if (local_1033 != false) {
    if ((local_86a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_850);
    }
    if ((local_869 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_868);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_830);
    qpdf::Array::erase((Array *)local_68,6);
    iVar3 = qpdf::Array::size((Array *)local_68);
    if (iVar3 != 6) {
      __assert_fail("a.size() == 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x38,"int main()");
    }
    local_8c1 = 0;
    local_8c2 = 0;
    qpdf::Array::at(&local_888,(Array *)local_68,0);
    bVar2 = QPDFObjectHandle::isName(&local_888.second);
    local_103a = false;
    if (bVar2) {
      qpdf::Array::at(&local_8c0,(Array *)local_68,0);
      local_8c1 = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_8a8,&local_8c0.second);
      local_8c2 = 1;
      local_103a = std::operator==(&local_8a8,"/First");
    }
    if (local_103a == false) {
      __assert_fail("a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x39,"int main()");
    }
    if ((local_8c2 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_8a8);
    }
    if ((local_8c1 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_8c0);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_888);
    local_8f9 = 0;
    qpdf::Array::at(&local_8e0,(Array *)local_68,1);
    bVar1 = QPDFObjectHandle::isInteger(&local_8e0.second);
    bVar2 = false;
    if (bVar1) {
      qpdf::Array::at(&local_8f8,(Array *)local_68,1);
      local_8f9 = 1;
      lVar4 = QPDFObjectHandle::getIntValue(&local_8f8.second);
      bVar2 = lVar4 == 1;
    }
    if (!bVar2) {
      __assert_fail("a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x3a,"int main()");
    }
    if ((local_8f9 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_8f8);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_8e0);
    local_951 = 0;
    local_952 = 0;
    qpdf::Array::at(&local_918,(Array *)local_68,3);
    bVar2 = QPDFObjectHandle::isName(&local_918.second);
    local_104a = false;
    if (bVar2) {
      qpdf::Array::at(&local_950,(Array *)local_68,3);
      local_951 = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_938,&local_950.second);
      local_952 = 1;
      local_104a = std::operator==(&local_938,"/Third");
    }
    if (local_104a == false) {
      __assert_fail("a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x3b,"int main()");
    }
    if ((local_952 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_938);
    }
    if ((local_951 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_950);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_918);
    qpdf::Array::at(&local_970,(Array *)local_68,4);
    bVar2 = QPDFObjectHandle::isNull(&local_970.second);
    if (!bVar2) {
      __assert_fail("a.at(4).second.isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x3c,"int main()");
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_970);
    qpdf::Array::at(&local_988,(Array *)local_68,5);
    bVar2 = QPDFObjectHandle::isNull(&local_988.second);
    if (!bVar2) {
      __assert_fail("a.at(5).second.isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x3d,"int main()");
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_988);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"12",&local_9b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"",&local_9e1);
    QPDFObjectHandle::parse(&local_998,&local_9b8,&local_9e0);
    qpdf::Array::setAt((Array *)local_68,4,&local_998);
    QPDFObjectHandle::~QPDFObjectHandle(&local_998);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    local_a19 = 0;
    qpdf::Array::at(&local_a00,(Array *)local_68,4);
    bVar1 = QPDFObjectHandle::isInteger(&local_a00.second);
    bVar2 = false;
    if (bVar1) {
      qpdf::Array::at(&local_a18,(Array *)local_68,4);
      local_a19 = 1;
      lVar4 = QPDFObjectHandle::getIntValue(&local_a18.second);
      bVar2 = lVar4 == 0xc;
    }
    if (!bVar2) {
      __assert_fail("a.at(4).second.isInteger() && (a.at(4).second.getIntValue() == 12)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x40,"int main()");
    }
    if ((local_a19 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_a18);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_a00);
    QPDFObjectHandle::newNull();
    qpdf::Array::setAt((Array *)local_68,4,&local_a30);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a30);
    qpdf::Array::at(&local_a48,(Array *)local_68,4);
    bVar2 = QPDFObjectHandle::isNull(&local_a48.second);
    if (!bVar2) {
      __assert_fail("a.at(4).second.isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x42,"int main()");
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_a48);
    iVar3 = qpdf::Array::size((Array *)local_68);
    qpdf::Array::erase((Array *)local_68,iVar3 + -1);
    iVar3 = qpdf::Array::size((Array *)local_68);
    if (iVar3 != 5) {
      __assert_fail("a.size() == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x45,"int main()");
    }
    local_a99 = 0;
    local_a9a = 0;
    qpdf::Array::at(&local_a60,(Array *)local_68,0);
    bVar2 = QPDFObjectHandle::isName(&local_a60.second);
    local_107e = false;
    if (bVar2) {
      qpdf::Array::at(&local_a98,(Array *)local_68,0);
      local_a99 = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_a80,&local_a98.second);
      local_a9a = 1;
      local_107e = std::operator==(&local_a80,"/First");
    }
    if (local_107e == false) {
      __assert_fail("a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x46,"int main()");
    }
    if ((local_a9a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a80);
    }
    if ((local_a99 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_a98);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_a60);
    local_ad1 = 0;
    qpdf::Array::at(&local_ab8,(Array *)local_68,1);
    bVar1 = QPDFObjectHandle::isInteger(&local_ab8.second);
    bVar2 = false;
    if (bVar1) {
      qpdf::Array::at(&local_ad0,(Array *)local_68,1);
      local_ad1 = 1;
      lVar4 = QPDFObjectHandle::getIntValue(&local_ad0.second);
      bVar2 = lVar4 == 1;
    }
    if (!bVar2) {
      __assert_fail("a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x47,"int main()");
    }
    if ((local_ad1 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_ad0);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_ab8);
    local_b29 = 0;
    local_b2a = 0;
    qpdf::Array::at(&local_af0,(Array *)local_68,3);
    bVar2 = QPDFObjectHandle::isName(&local_af0.second);
    local_1092 = false;
    if (bVar2) {
      qpdf::Array::at(&local_b28,(Array *)local_68,3);
      local_b29 = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_b10,&local_b28.second);
      local_b2a = 1;
      local_1092 = std::operator==(&local_b10,"/Third");
    }
    if (local_1092 == false) {
      __assert_fail("a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x48,"int main()");
    }
    if ((local_b2a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b10);
    }
    if ((local_b29 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_b28);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_af0);
    qpdf::Array::at(&local_b48,(Array *)local_68,4);
    bVar2 = QPDFObjectHandle::isNull(&local_b48.second);
    if (!bVar2) {
      __assert_fail("a.at(4).second.isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x49,"int main()");
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_b48);
    iVar3 = qpdf::Array::size((Array *)local_68);
    qpdf::Array::erase((Array *)local_68,iVar3 + -1);
    iVar3 = qpdf::Array::size((Array *)local_68);
    if (iVar3 != 4) {
      __assert_fail("a.size() == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x4c,"int main()");
    }
    local_b99 = 0;
    local_b9a = 0;
    qpdf::Array::at(&local_b60,(Array *)local_68,0);
    bVar2 = QPDFObjectHandle::isName(&local_b60.second);
    local_109e = false;
    if (bVar2) {
      qpdf::Array::at(&local_b98,(Array *)local_68,0);
      local_b99 = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_b80,&local_b98.second);
      local_b9a = 1;
      local_109e = std::operator==(&local_b80,"/First");
    }
    if (local_109e == false) {
      __assert_fail("a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x4d,"int main()");
    }
    if ((local_b9a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b80);
    }
    if ((local_b99 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_b98);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_b60);
    local_bd1 = 0;
    qpdf::Array::at(&local_bb8,(Array *)local_68,1);
    bVar1 = QPDFObjectHandle::isInteger(&local_bb8.second);
    bVar2 = false;
    if (bVar1) {
      qpdf::Array::at(&local_bd0,(Array *)local_68,1);
      local_bd1 = 1;
      lVar4 = QPDFObjectHandle::getIntValue(&local_bd0.second);
      bVar2 = lVar4 == 1;
    }
    if (!bVar2) {
      __assert_fail("a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x4e,"int main()");
    }
    if ((local_bd1 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_bd0);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_bb8);
    local_c29 = 0;
    local_c2a = 0;
    qpdf::Array::at(&local_bf0,(Array *)local_68,3);
    bVar2 = QPDFObjectHandle::isName(&local_bf0.second);
    local_10b2 = false;
    if (bVar2) {
      qpdf::Array::at(&local_c28,(Array *)local_68,3);
      local_c29 = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_c10,&local_c28.second);
      local_c2a = 1;
      local_10b2 = std::operator==(&local_c10,"/Third");
    }
    if (local_10b2 == false) {
      __assert_fail("a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x4f,"int main()");
    }
    if ((local_c2a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c10);
    }
    if ((local_c29 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_c28);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_bf0);
    iVar3 = qpdf::Array::size((Array *)local_68);
    qpdf::Array::erase((Array *)local_68,iVar3 + -1);
    iVar3 = qpdf::Array::size((Array *)local_68);
    if (iVar3 != 3) {
      __assert_fail("a.size() == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x52,"int main()");
    }
    local_c81 = 0;
    local_c82 = 0;
    qpdf::Array::at(&local_c48,(Array *)local_68,0);
    bVar2 = QPDFObjectHandle::isName(&local_c48.second);
    local_10be = false;
    if (bVar2) {
      qpdf::Array::at(&local_c80,(Array *)local_68,0);
      local_c81 = 1;
      QPDFObjectHandle::getName_abi_cxx11_(&local_c68,&local_c80.second);
      local_c82 = 1;
      local_10be = std::operator==(&local_c68,"/First");
    }
    if (local_10be == false) {
      __assert_fail("a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x53,"int main()");
    }
    if ((local_c82 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c68);
    }
    if ((local_c81 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_c80);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_c48);
    local_cb9 = 0;
    qpdf::Array::at(&local_ca0,(Array *)local_68,1);
    bVar1 = QPDFObjectHandle::isInteger(&local_ca0.second);
    bVar2 = false;
    if (bVar1) {
      qpdf::Array::at(&local_cb8,(Array *)local_68,1);
      local_cb9 = 1;
      lVar4 = QPDFObjectHandle::getIntValue(&local_cb8.second);
      bVar2 = lVar4 == 1;
    }
    if (!bVar2) {
      __assert_fail("a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x54,"int main()");
    }
    if ((local_cb9 & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_cb8);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_ca0);
    pdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl._7_1_ = 0;
    pdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl._6_1_ = 0;
    qpdf::Array::at(&local_cd8,(Array *)local_68,2);
    bVar2 = QPDFObjectHandle::isString(&local_cd8.second);
    local_10d2 = false;
    if (bVar2) {
      qpdf::Array::at(&local_d10,(Array *)local_68,2);
      pdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl._7_1_ = 1;
      QPDFObjectHandle::getStringValue_abi_cxx11_(&local_cf8,&local_d10.second);
      pdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl._6_1_ = 1;
      local_10d2 = std::operator==(&local_cf8,"potato");
    }
    if (local_10d2 == false) {
      __assert_fail("a.at(2).second.isString() && (a.at(2).second.getStringValue() == \"potato\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x55,"int main()");
    }
    if ((pdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl._6_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_cf8);
    }
    if ((pdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl._7_1_ & 1) != 0) {
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_d10);
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_cd8);
    QPDF::QPDF((QPDF *)&stack0xfffffffffffff2e0);
    QPDF::emptyPDF((QPDF *)&stack0xfffffffffffff2e0);
    operator____qpdf((char *)&local_d78,0x416ec7);
    QPDFObjectHandle::getObj(&local_d68);
    QPDFObjectHandle::QPDFObjectHandle(&local_d58,(shared_ptr<QPDFObject> *)&local_d68);
    this = (allocator<QPDFObjectHandle> *)
           ((long)&b.sp_elements._M_t.
                   super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
           + 7);
    std::allocator<QPDFObjectHandle>::allocator(this);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              (&local_d48,10,&local_d58,this);
    b.sp_elements._M_t.
    super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    .
    super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
    ._M_head_impl._6_1_ = 1;
    QPDFObject::
    create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
              ((QPDFObject *)local_d30,&local_d48,
               (bool *)((long)&b.sp_elements._M_t.
                               super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                       + 6));
    std::shared_ptr<QPDFObject>::operator=
              ((shared_ptr<QPDFObject> *)local_20,(shared_ptr<QPDFObject> *)local_d30);
    std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_d30);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_d48);
    std::allocator<QPDFObjectHandle>::~allocator
              ((allocator<QPDFObjectHandle> *)
               ((long)&b.sp_elements._M_t.
                       super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
               + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_d58);
    std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_d68);
    QPDFObjectHandle::~QPDFObjectHandle(&local_d78);
    qpdf::Array::Array((Array *)local_d98,(shared_ptr<QPDFObject> *)local_20);
    QPDF::newIndirectNull((QPDF *)&local_da8);
    qpdf::Array::setAt((Array *)local_d98,5,&local_da8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_da8);
    operator____qpdf((char *)&local_db8,0x4114c6);
    qpdf::Array::setAt((Array *)local_d98,7,&local_db8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_db8);
    qpdf::Array::at(&local_dd0,(Array *)local_d98,3);
    bVar2 = QPDFObjectHandle::isNull(&local_dd0.second);
    if (!bVar2) {
      __assert_fail("b.at(3).second.isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x5f,"int main()");
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_dd0);
    qpdf::Array::at(&local_de8,(Array *)local_d98,8);
    bVar2 = QPDFObjectHandle::isNull(&local_de8.second);
    if (!bVar2) {
      __assert_fail("b.at(8).second.isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x60,"int main()");
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_de8);
    qpdf::Array::at(&local_e00,(Array *)local_d98,5);
    bVar2 = QPDFObjectHandle::isIndirect(&local_e00.second);
    if (!bVar2) {
      __assert_fail("b.at(5).second.isIndirect()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x61,"int main()");
    }
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_e00);
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)
               &c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<QPDFObject> *)local_20);
    QPDFObjectHandle::unparse_abi_cxx11_
              (&local_e20,
               (QPDFObjectHandle *)
               &c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar2 = std::operator==(&local_e20,
                            "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");
    if (!bVar2) {
      __assert_fail("QPDFObjectHandle(obj).unparse() == \"[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,100,"int main()");
    }
    std::__cxx11::string::~string((string *)&local_e20);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)
               &d.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<QPDFObject> *)local_20);
    QPDFObjectHandle::unsafeShallowCopy((QPDFObjectHandle *)local_e40);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &d.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFObjectHandle::QPDFObjectHandle(&local_e70,(shared_ptr<QPDFObject> *)local_20);
    QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)local_e60);
    QPDFObjectHandle::~QPDFObjectHandle(&local_e70);
    qpdf::Array::at(&local_e88,(Array *)local_d98,7);
    operator____qpdf((char *)&local_e98,0x4115bd);
    QPDFObjectHandle::setArrayItem(&local_e88.second,2,&local_e98);
    QPDFObjectHandle::~QPDFObjectHandle(&local_e98);
    std::pair<bool,_QPDFObjectHandle>::~pair(&local_e88);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_eb8,(QPDFObjectHandle *)local_e40);
    bVar2 = std::operator==(&local_eb8,
                            "[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]");
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_eb8);
      QPDFObjectHandle::unparse_abi_cxx11_(&local_ed8,(QPDFObjectHandle *)local_e60);
      bVar2 = std::operator==(&local_ed8,
                              "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_ed8);
        anon_var_0 = (logic_error *)0x0;
        _Stack_ee0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&anon_var_0);
        qpdf::Array::setAt((Array *)local_d98,3,(QPDFObjectHandle *)&anon_var_0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&anon_var_0);
        std::operator<<((ostream *)&std::cout,"inserted uninitialized object\n");
        QPDF::QPDF(&local_ef8);
        QPDF::emptyPDF(&local_ef8);
        QPDFObjectHandle::QPDFObjectHandle(&local_f18,(shared_ptr<QPDFObject> *)local_20);
        QPDF::makeIndirectObject((QPDF *)&local_f08,(QPDFObjectHandle *)&stack0xfffffffffffff2e0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_f08);
        QPDFObjectHandle::~QPDFObjectHandle(&local_f18);
        QPDF::getObject((QPDF *)&anon_var_0_1,(int)&local_ef8,1);
        qpdf::Array::setAt((Array *)local_d98,3,(QPDFObjectHandle *)&anon_var_0_1);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&anon_var_0_1);
        std::operator<<((ostream *)&std::cout,"inserted uninitialized object\n");
        this_00 = std::operator<<((ostream *)&std::cout,"sparse array tests done");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
        QPDF::~QPDF(&local_ef8);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e60);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e40);
        qpdf::Array::~Array((Array *)local_d98);
        QPDF::~QPDF((QPDF *)&stack0xfffffffffffff2e0);
        qpdf::Array::~Array((Array *)local_68);
        std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_20);
        return obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _4_4_;
      }
      __assert_fail("d.unparse() == \"[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                    ,0x69,"int main()");
    }
    __assert_fail("c.unparse() == \"[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                  ,0x68,"int main()");
  }
  __assert_fail("a.at(6).second.isName() && (a.at(6).second.getName() == \"/Quack\")",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                ,0x35,"int main()");
}

Assistant:

int
main()
{
    auto obj = QPDFObject::create<QPDF_Array>(std::vector<QPDFObjectHandle>(), true);
    auto a = qpdf::Array(obj);

    assert(a.size() == 0);

    a.push_back(QPDFObjectHandle::parse("1"));
    a.push_back(QPDFObjectHandle::parse("(potato)"));
    a.push_back(QPDFObjectHandle::parse("null"));
    a.push_back(QPDFObjectHandle::parse("null"));
    a.push_back(QPDFObjectHandle::parse("/Quack"));
    assert(a.size() == 5);
    assert(a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1));
    assert(a.at(1).second.isString() && (a.at(1).second.getStringValue() == "potato"));
    assert(a.at(2).second.isNull());
    assert(a.at(3).second.isNull());
    assert(a.at(4).second.isName() && (a.at(4).second.getName() == "/Quack"));

    a.insert(4, QPDFObjectHandle::parse("/BeforeQuack"));
    assert(a.size() == 6);
    assert(a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1));
    assert(a.at(4).second.isName() && (a.at(4).second.getName() == "/BeforeQuack"));
    assert(a.at(5).second.isName() && (a.at(5).second.getName() == "/Quack"));

    a.insert(2, QPDFObjectHandle::parse("/Third"));
    assert(a.size() == 7);
    assert(a.at(1).second.isString() && (a.at(1).second.getStringValue() == "potato"));
    assert(a.at(2).second.isName() && (a.at(2).second.getName() == "/Third"));
    assert(a.at(3).second.isNull());
    assert(a.at(6).second.isName() && (a.at(6).second.getName() == "/Quack"));

    a.insert(0, QPDFObjectHandle::parse("/First"));
    assert(a.size() == 8);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(7).second.isName() && (a.at(7).second.getName() == "/Quack"));

    a.erase(6);
    assert(a.size() == 7);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(5).second.isNull());
    assert(a.at(6).second.isName() && (a.at(6).second.getName() == "/Quack"));

    a.erase(6);
    assert(a.size() == 6);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));
    assert(a.at(4).second.isNull());
    assert(a.at(5).second.isNull());

    a.setAt(4, QPDFObjectHandle::parse("12"));
    assert(a.at(4).second.isInteger() && (a.at(4).second.getIntValue() == 12));
    a.setAt(4, QPDFObjectHandle::newNull());
    assert(a.at(4).second.isNull());

    a.erase(a.size() - 1);
    assert(a.size() == 5);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));
    assert(a.at(4).second.isNull());

    a.erase(a.size() - 1);
    assert(a.size() == 4);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));

    a.erase(a.size() - 1);
    assert(a.size() == 3);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(2).second.isString() && (a.at(2).second.getStringValue() == "potato"));

    QPDF pdf;
    pdf.emptyPDF();

    obj = QPDFObject::create<QPDF_Array>(
        std::vector<QPDFObjectHandle>{10, "null"_qpdf.getObj()}, true);
    auto b = qpdf::Array(obj);
    b.setAt(5, pdf.newIndirectNull());
    b.setAt(7, "[0 1 2 3]"_qpdf);
    assert(b.at(3).second.isNull());
    assert(b.at(8).second.isNull());
    assert(b.at(5).second.isIndirect());
    assert(
        QPDFObjectHandle(obj).unparse() ==
        "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");
    auto c = QPDFObjectHandle(obj).unsafeShallowCopy();
    auto d = QPDFObjectHandle(obj).shallowCopy();
    b.at(7).second.setArrayItem(2, "42"_qpdf);
    assert(c.unparse() == "[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]");
    assert(d.unparse() == "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");

    try {
        b.setAt(3, {});
        std::cout << "inserted uninitialized object\n";
    } catch (std::logic_error&) {
    }
    QPDF pdf2;
    pdf2.emptyPDF();
    try {
        pdf.makeIndirectObject(obj);
        b.setAt(3, pdf2.getObject(1, 0));
        std::cout << "inserted uninitialized object\n";
    } catch (std::logic_error&) {
    }

    std::cout << "sparse array tests done" << std::endl;
    return 0;
}